

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O1

int32_t __thiscall
icu_63::number::impl::DecimalQuantity::getUpperDisplayMagnitude(DecimalQuantity *this)

{
  int iVar1;
  int iVar2;
  
  iVar2 = this->precision + this->scale;
  iVar1 = this->lOptPos;
  if (iVar2 <= this->lOptPos) {
    iVar1 = iVar2;
  }
  if (iVar2 < this->lReqPos) {
    iVar1 = this->lReqPos;
  }
  return iVar1 + -1;
}

Assistant:

int32_t DecimalQuantity::getUpperDisplayMagnitude() const {
    // If this assertion fails, you need to call roundToInfinity() or some other rounding method.
    // See the comment in the header file explaining the "isApproximate" field.
    U_ASSERT(!isApproximate);

    int32_t magnitude = scale + precision;
    int32_t result = (lReqPos > magnitude) ? lReqPos : (lOptPos < magnitude) ? lOptPos : magnitude;
    return result - 1;
}